

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall
pybind11::capsule::capsule<pybind11::detail::accessor_policies::generic_item>
          (capsule *this,accessor<pybind11::detail::accessor_policies::generic_item> *a)

{
  object oStack_18;
  
  detail::accessor::operator_cast_to_object((accessor *)&oStack_18);
  capsule(this,&oStack_18);
  object::~object(&oStack_18);
  return;
}

Assistant:

capsule(PyObject *ptr, bool is_borrowed)
        : object(is_borrowed ? object(ptr, borrowed_t{}) : object(ptr, stolen_t{})) {}